

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::DeepTiledOutputFile::initialize(DeepTiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  LevelMode LVar1;
  LevelRoundingMode LVar2;
  uint uVar3;
  int iVar4;
  Format FVar5;
  LineOrder *pLVar6;
  TileDescription *pTVar7;
  Box2i *pBVar8;
  Compression *pCVar9;
  Compressor *pCVar10;
  TileBuffer *pTVar11;
  ArgExc *this_00;
  pointer ppTVar12;
  Data *pDVar13;
  ulong uVar14;
  stringstream _iex_throw_s;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_198 [15];
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)DEEPTILE_abi_cxx11_);
  pLVar6 = Header::lineOrder(&this->_data->header);
  pDVar13 = this->_data;
  pDVar13->lineOrder = *pLVar6;
  pTVar7 = Header::tileDescription(&pDVar13->header);
  pDVar13 = this->_data;
  uVar3 = pTVar7->ySize;
  LVar1 = pTVar7->mode;
  LVar2 = pTVar7->roundingMode;
  (pDVar13->tileDesc).xSize = pTVar7->xSize;
  (pDVar13->tileDesc).ySize = uVar3;
  (pDVar13->tileDesc).mode = LVar1;
  (pDVar13->tileDesc).roundingMode = LVar2;
  pBVar8 = Header::dataWindow(&this->_data->header);
  iVar4 = (pBVar8->min).x;
  pDVar13 = this->_data;
  pDVar13->minX = iVar4;
  maxX = (pBVar8->max).x;
  pDVar13->maxX = maxX;
  minY = (pBVar8->min).y;
  pDVar13->minY = minY;
  maxY = (pBVar8->max).y;
  pDVar13->maxY = maxY;
  uVar3 = (pDVar13->tileDesc).xSize * (pDVar13->tileDesc).ySize;
  pDVar13->maxSampleCountTableSize = (ulong)uVar3 * 4;
  if (uVar3 < 0x40000000) {
    precalculateTileInfo
              (&pDVar13->tileDesc,iVar4,maxX,minY,maxY,&pDVar13->numXTiles,&pDVar13->numYTiles,
               &pDVar13->numXLevels,&pDVar13->numYLevels);
    pDVar13 = this->_data;
    if (pDVar13->lineOrder == INCREASING_Y) {
      iVar4 = 0;
    }
    else {
      iVar4 = *pDVar13->numYTiles + -1;
    }
    (pDVar13->nextTileToWrite).dx = 0;
    (pDVar13->nextTileToWrite).dy = iVar4;
    (pDVar13->nextTileToWrite).lx = 0;
    (pDVar13->nextTileToWrite).ly = 0;
    pCVar9 = Header::compression(&pDVar13->header);
    pCVar10 = newTileCompressor(*pCVar9,0,(ulong)(this->_data->tileDesc).ySize,&this->_data->header)
    ;
    FVar5 = defaultFormat(pCVar10);
    pDVar13 = this->_data;
    pDVar13->format = FVar5;
    if (pCVar10 != (Compressor *)0x0) {
      (*pCVar10->_vptr_Compressor[1])(pCVar10);
      pDVar13 = this->_data;
    }
    TileOffsets::TileOffsets
              ((TileOffsets *)&_iex_throw_s,(pDVar13->tileDesc).mode,pDVar13->numXLevels,
               pDVar13->numYLevels,pDVar13->numXTiles,pDVar13->numYTiles);
    TileOffsets::operator=(&this->_data->tileOffsets,(TileOffsets *)&_iex_throw_s);
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(local_198);
    pDVar13 = this->_data;
    iVar4 = getChunkOffsetTableSize(&pDVar13->header);
    Header::setChunkCount(&pDVar13->header,iVar4);
    pDVar13 = this->_data;
    ppTVar12 = (pDVar13->tileBuffers).
               super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    for (uVar14 = 0;
        uVar14 < (ulong)((long)(pDVar13->tileBuffers).
                               super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar12 >> 3);
        uVar14 = uVar14 + 1) {
      pTVar11 = (TileBuffer *)operator_new(0xb8);
      (pTVar11->buffer)._size = 0;
      (pTVar11->buffer)._data = (char *)0x0;
      pTVar11->dataPtr = (char *)0x0;
      pTVar11->dataSize = 0;
      pTVar11->compressor = (Compressor *)0x0;
      (pTVar11->sampleCountTableBuffer)._size = 0;
      (pTVar11->sampleCountTableBuffer)._data = (char *)0x0;
      pTVar11->sampleCountTablePtr = (char *)0x0;
      pTVar11->sampleCountTableCompressor = (Compressor *)0x0;
      (pTVar11->tileCoord).dx = 0;
      (pTVar11->tileCoord).dy = 0;
      *(undefined8 *)((long)&(pTVar11->tileCoord).dx + 1) = 0;
      *(undefined8 *)((long)&(pTVar11->tileCoord).lx + 1) = 0;
      (pTVar11->exception)._M_dataplus._M_p = (pointer)&(pTVar11->exception).field_2;
      (pTVar11->exception)._M_string_length = 0;
      (pTVar11->exception).field_2._M_local_buf[0] = '\0';
      IlmThread_3_4::Semaphore::Semaphore(&pTVar11->_sem,1);
      (this->_data->tileBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar14] = pTVar11;
      Array<char>::resizeErase
                (&(this->_data->tileBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar14]->sampleCountTableBuffer,
                 this->_data->maxSampleCountTableSize);
      memset(((this->_data->tileBuffers).
              super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14]->sampleCountTableBuffer)._data,0,
             this->_data->maxSampleCountTableSize);
      pCVar9 = Header::compression(&this->_data->header);
      pCVar10 = newCompressor(*pCVar9,this->_data->maxSampleCountTableSize,&this->_data->header);
      pDVar13 = this->_data;
      ppTVar12 = (pDVar13->tileBuffers).
                 super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar12[uVar14]->sampleCountTableCompressor = pCVar10;
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::operator<<((ostream *)local_198,"Deep tile size exceeds maximum permitted area");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::initialize (const Header& header)
{
    _data->header = header;
    _data->header.setType (DEEPTILE);
    _data->lineOrder = _data->header.lineOrder ();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription ();

    //
    // Save the dataWindow information
    //

    const Box2i& dataWindow = _data->header.dataWindow ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->maxSampleCountTableSize =
        _data->tileDesc.ySize * _data->tileDesc.xSize * sizeof (int);

    //
    // impose limit of 2^32 bytes of storage for maxSampleCountTableSize
    // (disallow files with very large tile areas that would otherwise cause excessive memory allocation)
    //

    if (_data->maxSampleCountTableSize >
        std::numeric_limits<unsigned int>::max ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Deep tile size exceeds maximum permitted area");
    }

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (
        _data->tileDesc,
        _data->minX,
        _data->maxX,
        _data->minY,
        _data->maxY,
        _data->numXTiles,
        _data->numYTiles,
        _data->numXLevels,
        _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)
                                 ? TileCoord (0, 0, 0, 0)
                                 : TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    Compressor* compressor = newTileCompressor (
        _data->header.compression (), 0, _data->tileDesc.ySize, _data->header);

    _data->format = defaultFormat (compressor);

    if (compressor != 0) delete compressor;

    _data->tileOffsets = TileOffsets (
        _data->tileDesc.mode,
        _data->numXLevels,
        _data->numYLevels,
        _data->numXTiles,
        _data->numYTiles);

    //ignore the existing value of chunkCount - correct it if it's wrong
    _data->header.setChunkCount (getChunkOffsetTableSize (_data->header));

    for (size_t i = 0; i < _data->tileBuffers.size (); i++)
    {
        _data->tileBuffers[i] = new TileBuffer ();

        _data->tileBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        char* p = &(_data->tileBuffers[i]->sampleCountTableBuffer[0]);
        memset (p, 0, _data->maxSampleCountTableSize);

        _data->tileBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}